

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eckey_impl.h
# Opt level: O3

int secp256k1_eckey_pubkey_parse(secp256k1_ge *elem,uchar *pub,size_t size)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  int iVar145;
  ulong uVar146;
  ulong uVar147;
  ulong uVar148;
  ulong uVar149;
  ulong uVar150;
  ulong uVar151;
  ulong uVar152;
  ulong uVar153;
  ulong uVar154;
  ulong uVar155;
  ulong uVar156;
  ulong uVar157;
  secp256k1_fe y;
  secp256k1_fe x_1;
  secp256k1_fe x;
  secp256k1_fe local_a8;
  secp256k1_fe local_80;
  secp256k1_fe local_58;
  
  iVar145 = 0;
  if (size == 0x41) {
    if ((*pub < 8) && ((0xd0U >> (*pub & 0x1f) & 1) != 0)) {
      secp256k1_fe_impl_set_b32_mod(&local_80,pub + 1);
      iVar145 = 0;
      if (((local_80.n[0] < 0xffffefffffc2f) ||
          ((local_80.n[4] != 0xffffffffffff ||
           ((local_80.n[2] & local_80.n[3] & local_80.n[1]) != 0xfffffffffffff)))) &&
         ((secp256k1_fe_impl_set_b32_mod(&local_a8,pub + 0x21), local_a8.n[0] < 0xffffefffffc2f ||
          ((local_a8.n[4] != 0xffffffffffff ||
           ((local_a8.n[2] & local_a8.n[3] & local_a8.n[1]) != 0xfffffffffffff)))))) {
        elem->infinity = 0;
        (elem->x).n[4] = local_80.n[4];
        (elem->x).n[2] = local_80.n[2];
        (elem->x).n[3] = local_80.n[3];
        (elem->x).n[0] = local_80.n[0];
        (elem->x).n[1] = local_80.n[1];
        (elem->y).n[4] = local_a8.n[4];
        (elem->y).n[2] = local_a8.n[2];
        (elem->y).n[3] = local_a8.n[3];
        (elem->y).n[0] = local_a8.n[0];
        (elem->y).n[1] = local_a8.n[1];
        if (((*pub & 0xfe) == 6 & (*pub != 7 ^ (byte)local_a8.n[0] ^ 1)) == 0) {
          uVar152 = (elem->y).n[0];
          uVar2 = (elem->y).n[1];
          uVar3 = (elem->y).n[3];
          uVar148 = uVar152 * 2;
          auVar6._8_8_ = 0;
          auVar6._0_8_ = uVar3;
          auVar79._8_8_ = 0;
          auVar79._0_8_ = uVar148;
          uVar4 = (elem->y).n[2];
          auVar7._8_8_ = 0;
          auVar7._0_8_ = uVar4;
          auVar80._8_8_ = 0;
          auVar80._0_8_ = uVar2 * 2;
          uVar5 = (elem->y).n[4];
          auVar8._8_8_ = 0;
          auVar8._0_8_ = uVar5;
          auVar81._8_8_ = 0;
          auVar81._0_8_ = uVar5;
          auVar9._8_8_ = 0;
          auVar9._0_8_ = SUB168(auVar8 * auVar81,0);
          auVar6 = auVar6 * auVar79 + auVar7 * auVar80 + auVar9 * ZEXT816(0x1000003d10);
          uVar5 = uVar5 * 2;
          auVar10._8_8_ = 0;
          auVar10._0_8_ = uVar5;
          auVar82._8_8_ = 0;
          auVar82._0_8_ = uVar152;
          auVar11._8_8_ = 0;
          auVar11._0_8_ = uVar3;
          auVar83._8_8_ = 0;
          auVar83._0_8_ = uVar2 * 2;
          auVar12._8_8_ = 0;
          auVar12._0_8_ = uVar4;
          auVar84._8_8_ = 0;
          auVar84._0_8_ = uVar4;
          auVar13._8_8_ = 0;
          auVar13._0_8_ = SUB168(auVar8 * auVar81,8);
          auVar7 = auVar13 * ZEXT816(0x1000003d10000) +
                   auVar10 * auVar82 + auVar12 * auVar84 + auVar11 * auVar83 + (auVar6 >> 0x34);
          auVar14._8_8_ = 0;
          auVar14._0_8_ = uVar152;
          auVar85._8_8_ = 0;
          auVar85._0_8_ = uVar152;
          auVar15._8_8_ = 0;
          auVar15._0_8_ = uVar5;
          auVar86._8_8_ = 0;
          auVar86._0_8_ = uVar2;
          auVar16._8_8_ = 0;
          auVar16._0_8_ = uVar3;
          auVar87._8_8_ = 0;
          auVar87._0_8_ = uVar4 * 2;
          auVar8 = auVar16 * auVar87 + auVar15 * auVar86 + (auVar7 >> 0x34);
          auVar17._8_8_ = 0;
          auVar17._0_8_ = (auVar8._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar7._6_2_ & 0xf);
          auVar9 = auVar17 * ZEXT816(0x1000003d1) + auVar14 * auVar85;
          uVar146 = auVar9._0_8_;
          uVar152 = auVar9._8_8_;
          auVar144._8_8_ = uVar152 >> 0x34;
          auVar144._0_8_ = uVar152 * 0x1000 | uVar146 >> 0x34;
          auVar18._8_8_ = 0;
          auVar18._0_8_ = uVar2;
          auVar88._8_8_ = 0;
          auVar88._0_8_ = uVar148;
          auVar19._8_8_ = 0;
          auVar19._0_8_ = uVar5;
          auVar89._8_8_ = 0;
          auVar89._0_8_ = uVar4;
          auVar20._8_8_ = 0;
          auVar20._0_8_ = uVar3;
          auVar90._8_8_ = 0;
          auVar90._0_8_ = uVar3;
          auVar8 = auVar20 * auVar90 + auVar19 * auVar89 + (auVar8 >> 0x34);
          auVar21._8_8_ = 0;
          auVar21._0_8_ = auVar8._0_8_ & 0xfffffffffffff;
          auVar144 = auVar21 * ZEXT816(0x1000003d10) + auVar18 * auVar88 + auVar144;
          uVar147 = auVar144._0_8_;
          uVar152 = auVar144._8_8_;
          auVar134._8_8_ = uVar152 >> 0x34;
          auVar134._0_8_ = uVar152 * 0x1000 | uVar147 >> 0x34;
          auVar22._8_8_ = 0;
          auVar22._0_8_ = uVar4;
          auVar91._8_8_ = 0;
          auVar91._0_8_ = uVar148;
          auVar23._8_8_ = 0;
          auVar23._0_8_ = uVar2;
          auVar92._8_8_ = 0;
          auVar92._0_8_ = uVar2;
          auVar24._8_8_ = 0;
          auVar24._0_8_ = uVar5;
          auVar93._8_8_ = 0;
          auVar93._0_8_ = uVar3;
          auVar8 = auVar24 * auVar93 + (auVar8 >> 0x34);
          auVar25._8_8_ = 0;
          auVar25._0_8_ = auVar8._0_8_;
          auVar134 = auVar25 * ZEXT816(0x1000003d10) + auVar23 * auVar92 + auVar22 * auVar91 +
                     auVar134;
          auVar9 = auVar134 >> 0x34;
          auVar139._8_8_ = 0;
          auVar139._0_8_ = auVar9._0_8_;
          auVar26._8_8_ = 0;
          auVar26._0_8_ = auVar8._8_8_;
          auVar138._8_8_ = auVar9._8_8_;
          auVar138._0_8_ = auVar6._0_8_ & 0xffffffffffffe;
          auVar139 = auVar26 * ZEXT816(0x1000003d10000) + auVar138 + auVar139;
          uVar149 = auVar139._0_8_;
          uVar152 = (elem->x).n[0];
          uVar2 = (elem->x).n[3];
          uVar148 = uVar152 * 2;
          auVar27._8_8_ = 0;
          auVar27._0_8_ = uVar2;
          auVar94._8_8_ = 0;
          auVar94._0_8_ = uVar148;
          uVar3 = (elem->x).n[1];
          uVar4 = (elem->x).n[2];
          auVar28._8_8_ = 0;
          auVar28._0_8_ = uVar4;
          auVar95._8_8_ = 0;
          auVar95._0_8_ = uVar3 * 2;
          uVar5 = (elem->x).n[4];
          auVar29._8_8_ = 0;
          auVar29._0_8_ = uVar5;
          auVar96._8_8_ = 0;
          auVar96._0_8_ = uVar5;
          auVar30._8_8_ = 0;
          auVar30._0_8_ = SUB168(auVar29 * auVar96,0);
          auVar6 = auVar30 * ZEXT816(0x1000003d10) + auVar28 * auVar95 + auVar27 * auVar94;
          uVar156 = uVar5 * 2;
          auVar31._8_8_ = 0;
          auVar31._0_8_ = uVar156;
          auVar97._8_8_ = 0;
          auVar97._0_8_ = uVar152;
          auVar32._8_8_ = 0;
          auVar32._0_8_ = uVar2;
          auVar98._8_8_ = 0;
          auVar98._0_8_ = uVar3 * 2;
          auVar33._8_8_ = 0;
          auVar33._0_8_ = uVar4;
          auVar99._8_8_ = 0;
          auVar99._0_8_ = uVar4;
          auVar34._8_8_ = 0;
          auVar34._0_8_ = SUB168(auVar29 * auVar96,8);
          auVar10 = auVar34 * ZEXT816(0x1000003d10000) +
                    auVar31 * auVar97 + auVar33 * auVar99 + auVar32 * auVar98 + (auVar6 >> 0x34);
          auVar35._8_8_ = 0;
          auVar35._0_8_ = uVar152;
          auVar100._8_8_ = 0;
          auVar100._0_8_ = uVar152;
          auVar36._8_8_ = 0;
          auVar36._0_8_ = uVar156;
          auVar101._8_8_ = 0;
          auVar101._0_8_ = uVar3;
          auVar37._8_8_ = 0;
          auVar37._0_8_ = uVar2;
          auVar102._8_8_ = 0;
          auVar102._0_8_ = uVar4 * 2;
          auVar8 = auVar37 * auVar102 + auVar36 * auVar101 + (auVar10 >> 0x34);
          auVar38._8_8_ = 0;
          auVar38._0_8_ = (auVar8._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar10._6_2_ & 0xf);
          auVar9 = auVar38 * ZEXT816(0x1000003d1) + auVar35 * auVar100;
          auVar39._8_8_ = 0;
          auVar39._0_8_ = uVar3;
          auVar103._8_8_ = 0;
          auVar103._0_8_ = uVar148;
          auVar40._8_8_ = 0;
          auVar40._0_8_ = uVar156;
          auVar104._8_8_ = 0;
          auVar104._0_8_ = uVar4;
          auVar41._8_8_ = 0;
          auVar41._0_8_ = uVar2;
          auVar105._8_8_ = 0;
          auVar105._0_8_ = uVar2;
          auVar8 = auVar41 * auVar105 + auVar40 * auVar104 + (auVar8 >> 0x34);
          auVar42._8_8_ = 0;
          auVar42._0_8_ = auVar8._0_8_ & 0xfffffffffffff;
          auVar11 = (auVar9 >> 0x34) + auVar39 * auVar103 + auVar42 * ZEXT816(0x1000003d10);
          uVar150 = auVar11._0_8_;
          uVar151 = auVar11._8_8_;
          auVar43._8_8_ = 0;
          auVar43._0_8_ = uVar4;
          auVar106._8_8_ = 0;
          auVar106._0_8_ = uVar148;
          auVar135._8_8_ = uVar151 >> 0x34;
          auVar135._0_8_ = uVar151 * 0x1000 | uVar150 >> 0x34;
          auVar44._8_8_ = 0;
          auVar44._0_8_ = uVar3;
          auVar107._8_8_ = 0;
          auVar107._0_8_ = uVar3;
          auVar45._8_8_ = 0;
          auVar45._0_8_ = uVar156;
          auVar108._8_8_ = 0;
          auVar108._0_8_ = uVar2;
          auVar8 = auVar45 * auVar108 + (auVar8 >> 0x34);
          auVar46._8_8_ = 0;
          auVar46._0_8_ = auVar8._0_8_;
          auVar135 = auVar43 * auVar106 + auVar44 * auVar107 + auVar46 * ZEXT816(0x1000003d10) +
                     auVar135;
          auVar11 = auVar135 >> 0x34;
          auVar140._8_8_ = auVar11._8_8_;
          auVar140._0_8_ = auVar6._0_8_ & 0xffffffffffffe;
          auVar141._8_8_ = 0;
          auVar141._0_8_ = auVar11._0_8_;
          auVar47._8_8_ = 0;
          auVar47._0_8_ = auVar8._8_8_;
          auVar141 = auVar47 * ZEXT816(0x1000003d10000) + auVar140 + auVar141;
          uVar156 = auVar141._0_8_;
          uVar148 = auVar9._0_8_ & 0xfffffffffffff;
          auVar48._8_8_ = 0;
          auVar48._0_8_ = uVar148;
          auVar109._8_8_ = 0;
          auVar109._0_8_ = uVar2;
          uVar157 = (auVar141._8_8_ << 0xc | uVar156 >> 0x34) + (auVar10._0_8_ & 0xffffffffffff);
          uVar150 = uVar150 & 0xfffffffffffff;
          auVar49._8_8_ = 0;
          auVar49._0_8_ = uVar150;
          auVar110._8_8_ = 0;
          auVar110._0_8_ = uVar4;
          uVar154 = auVar135._0_8_ & 0xfffffffffffff;
          auVar50._8_8_ = 0;
          auVar50._0_8_ = uVar154;
          auVar111._8_8_ = 0;
          auVar111._0_8_ = uVar3;
          uVar156 = uVar156 & 0xfffffffffffff;
          auVar51._8_8_ = 0;
          auVar51._0_8_ = uVar156;
          auVar112._8_8_ = 0;
          auVar112._0_8_ = uVar152;
          auVar52._8_8_ = 0;
          auVar52._0_8_ = uVar157;
          auVar113._8_8_ = 0;
          auVar113._0_8_ = uVar5;
          auVar53._8_8_ = 0;
          auVar53._0_8_ = SUB168(auVar52 * auVar113,0);
          auVar9 = auVar49 * auVar110 + auVar48 * auVar109 + auVar50 * auVar111 + auVar51 * auVar112
                   + auVar53 * ZEXT816(0x1000003d10);
          auVar54._8_8_ = 0;
          auVar54._0_8_ = uVar148;
          auVar114._8_8_ = 0;
          auVar114._0_8_ = uVar5;
          auVar55._8_8_ = 0;
          auVar55._0_8_ = uVar150;
          auVar115._8_8_ = 0;
          auVar115._0_8_ = uVar2;
          auVar56._8_8_ = 0;
          auVar56._0_8_ = uVar154;
          auVar116._8_8_ = 0;
          auVar116._0_8_ = uVar4;
          auVar57._8_8_ = 0;
          auVar57._0_8_ = uVar156;
          auVar117._8_8_ = 0;
          auVar117._0_8_ = uVar3;
          auVar58._8_8_ = 0;
          auVar58._0_8_ = uVar157;
          auVar118._8_8_ = 0;
          auVar118._0_8_ = uVar152;
          auVar59._8_8_ = 0;
          auVar59._0_8_ = SUB168(auVar52 * auVar113,8);
          auVar6 = auVar59 * ZEXT816(0x1000003d10000) +
                   auVar58 * auVar118 +
                   auVar57 * auVar117 + auVar56 * auVar116 + auVar55 * auVar115 + auVar54 * auVar114
                   + (auVar9 >> 0x34);
          auVar60._8_8_ = 0;
          auVar60._0_8_ = uVar148;
          auVar119._8_8_ = 0;
          auVar119._0_8_ = uVar152;
          auVar61._8_8_ = 0;
          auVar61._0_8_ = uVar150;
          auVar120._8_8_ = 0;
          auVar120._0_8_ = uVar5;
          auVar62._8_8_ = 0;
          auVar62._0_8_ = uVar154;
          auVar121._8_8_ = 0;
          auVar121._0_8_ = uVar2;
          auVar63._8_8_ = 0;
          auVar63._0_8_ = uVar156;
          auVar122._8_8_ = 0;
          auVar122._0_8_ = uVar4;
          auVar64._8_8_ = 0;
          auVar64._0_8_ = uVar157;
          auVar123._8_8_ = 0;
          auVar123._0_8_ = uVar3;
          auVar8 = auVar64 * auVar123 + auVar63 * auVar122 + auVar62 * auVar121 + auVar61 * auVar120
                   + (auVar6 >> 0x34);
          auVar65._8_8_ = 0;
          auVar65._0_8_ = (auVar8._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar6._6_2_ & 0xf);
          auVar10 = auVar65 * ZEXT816(0x1000003d1) + auVar60 * auVar119;
          uVar151 = auVar10._0_8_;
          uVar153 = auVar10._8_8_;
          auVar136._8_8_ = uVar153 >> 0x34;
          auVar136._0_8_ = uVar153 * 0x1000 | uVar151 >> 0x34;
          auVar66._8_8_ = 0;
          auVar66._0_8_ = uVar148;
          auVar124._8_8_ = 0;
          auVar124._0_8_ = uVar3;
          auVar67._8_8_ = 0;
          auVar67._0_8_ = uVar150;
          auVar125._8_8_ = 0;
          auVar125._0_8_ = uVar152;
          auVar68._8_8_ = 0;
          auVar68._0_8_ = uVar154;
          auVar126._8_8_ = 0;
          auVar126._0_8_ = uVar5;
          auVar69._8_8_ = 0;
          auVar69._0_8_ = uVar156;
          auVar127._8_8_ = 0;
          auVar127._0_8_ = uVar2;
          auVar70._8_8_ = 0;
          auVar70._0_8_ = uVar157;
          auVar128._8_8_ = 0;
          auVar128._0_8_ = uVar4;
          auVar8 = (auVar8 >> 0x34) + auVar70 * auVar128 + auVar69 * auVar127 + auVar68 * auVar126;
          uVar155 = auVar8._0_8_;
          uVar153 = auVar8._8_8_;
          auVar71._8_8_ = 0;
          auVar71._0_8_ = uVar155 & 0xfffffffffffff;
          auVar136 = auVar71 * ZEXT816(0x1000003d10) + auVar67 * auVar125 + auVar66 * auVar124 +
                     auVar136;
          auVar137._8_8_ = uVar153 >> 0x34;
          auVar137._0_8_ = uVar153 * 0x1000 | uVar155 >> 0x34;
          auVar72._8_8_ = 0;
          auVar72._0_8_ = uVar148;
          auVar129._8_8_ = 0;
          auVar129._0_8_ = uVar4;
          auVar73._8_8_ = 0;
          auVar73._0_8_ = uVar150;
          auVar130._8_8_ = 0;
          auVar130._0_8_ = uVar3;
          auVar74._8_8_ = 0;
          auVar74._0_8_ = uVar154;
          auVar131._8_8_ = 0;
          auVar131._0_8_ = uVar152;
          auVar75._8_8_ = 0;
          auVar75._0_8_ = uVar156;
          auVar132._8_8_ = 0;
          auVar132._0_8_ = uVar5;
          auVar76._8_8_ = 0;
          auVar76._0_8_ = uVar157;
          auVar133._8_8_ = 0;
          auVar133._0_8_ = uVar2;
          auVar137 = auVar76 * auVar133 + auVar75 * auVar132 + auVar137;
          auVar77._8_8_ = 0;
          auVar77._0_8_ = auVar137._0_8_;
          auVar8 = auVar77 * ZEXT816(0x1000003d10) +
                   auVar74 * auVar131 + auVar73 * auVar130 + auVar72 * auVar129 + (auVar136 >> 0x34)
          ;
          auVar10 = auVar8 >> 0x34;
          auVar143._8_8_ = 0;
          auVar143._0_8_ = auVar10._0_8_;
          auVar78._8_8_ = 0;
          auVar78._0_8_ = auVar137._8_8_;
          auVar142._8_8_ = auVar10._8_8_;
          auVar142._0_8_ = auVar9._0_8_ & 0xfffffffffffff;
          auVar143 = auVar78 * ZEXT816(0x1000003d10000) + auVar142 + auVar143;
          uVar152 = auVar143._0_8_;
          local_58.n[0] =
               ((uVar151 & 0xfffffffffffff) - (uVar146 & 0xfffffffffffff)) + 0x3ffffbfffff0c3;
          local_58.n[1] =
               ((auVar136._0_8_ & 0xfffffffffffff) - (uVar147 & 0xfffffffffffff)) + 0x3ffffffffffffc
          ;
          local_58.n[2] =
               ((auVar8._0_8_ & 0xfffffffffffff) - (auVar134._0_8_ & 0xfffffffffffff)) +
               0x3ffffffffffffc;
          local_58.n[3] =
               ((uVar152 & 0xfffffffffffff) - (uVar149 & 0xfffffffffffff)) + 0x3ffffffffffffc;
          local_58.n[4] =
               ((auVar6._0_8_ & 0xffffffffffff) -
               ((auVar139._8_8_ << 0xc | uVar149 >> 0x34) + (auVar7._0_8_ & 0xffffffffffff))) +
               0x3fffffffffffc + (auVar143._8_8_ << 0xc | uVar152 >> 0x34);
          iVar145 = secp256k1_fe_impl_normalizes_to_zero(&local_58);
        }
      }
    }
  }
  else {
    iVar145 = 0;
    if (((size == 0x21) && (bVar1 = *pub, (bVar1 & 0xfe) == 2)) &&
       ((secp256k1_fe_impl_set_b32_mod(&local_58,pub + 1), local_58.n[0] < 0xffffefffffc2f ||
        ((local_58.n[4] != 0xffffffffffff ||
         (iVar145 = 0, (local_58.n[2] & local_58.n[3] & local_58.n[1]) != 0xfffffffffffff)))))) {
      iVar145 = secp256k1_ge_set_xo_var(elem,&local_58,(uint)(bVar1 == 3));
    }
  }
  return iVar145;
}

Assistant:

static int secp256k1_eckey_pubkey_parse(secp256k1_ge *elem, const unsigned char *pub, size_t size) {
    if (size == 33 && (pub[0] == SECP256K1_TAG_PUBKEY_EVEN || pub[0] == SECP256K1_TAG_PUBKEY_ODD)) {
        secp256k1_fe x;
        return secp256k1_fe_set_b32_limit(&x, pub+1) && secp256k1_ge_set_xo_var(elem, &x, pub[0] == SECP256K1_TAG_PUBKEY_ODD);
    } else if (size == 65 && (pub[0] == SECP256K1_TAG_PUBKEY_UNCOMPRESSED || pub[0] == SECP256K1_TAG_PUBKEY_HYBRID_EVEN || pub[0] == SECP256K1_TAG_PUBKEY_HYBRID_ODD)) {
        secp256k1_fe x, y;
        if (!secp256k1_fe_set_b32_limit(&x, pub+1) || !secp256k1_fe_set_b32_limit(&y, pub+33)) {
            return 0;
        }
        secp256k1_ge_set_xy(elem, &x, &y);
        if ((pub[0] == SECP256K1_TAG_PUBKEY_HYBRID_EVEN || pub[0] == SECP256K1_TAG_PUBKEY_HYBRID_ODD) &&
            secp256k1_fe_is_odd(&y) != (pub[0] == SECP256K1_TAG_PUBKEY_HYBRID_ODD)) {
            return 0;
        }
        return secp256k1_ge_is_valid_var(elem);
    } else {
        return 0;
    }
}